

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  
  pbVar4 = (byte *)(ptr + ((long)end - (long)ptr & 0xfffffffffffffffe));
  if (((long)end - (long)ptr & 1U) == 0) {
    pbVar4 = (byte *)end;
  }
  iVar5 = 0;
LAB_001570f8:
  do {
    while( true ) {
      pbVar2 = (byte *)ptr;
      if (pbVar2 == pbVar4) {
        return -1;
      }
      bVar1 = pbVar2[1];
      if (3 < bVar1 - 0xd8) break;
switchD_0015717c_caseD_7:
      if ((long)pbVar4 - (long)pbVar2 < 4) {
        return -2;
      }
      ptr = (char *)(pbVar2 + 4);
    }
    iVar3 = 0;
    if (bVar1 != 0) {
      if (bVar1 == 0xff) {
        if (0xfd < *pbVar2) goto switchD_0015717c_caseD_0;
      }
      else if (bVar1 - 0xdc < 4) goto switchD_0015717c_caseD_0;
      goto switchD_0015717c_caseD_3;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar2)) {
    case 0:
    case 1:
    case 8:
      goto switchD_0015717c_caseD_0;
    case 2:
      ptr = (char *)(pbVar2 + 2);
      if ((byte *)ptr == pbVar4) {
        return -1;
      }
      if ((pbVar2[3] == 0) && (*ptr == 0x21)) {
        ptr = (char *)(pbVar2 + 4);
        if ((byte *)ptr == pbVar4) {
          return -1;
        }
        if ((pbVar2[5] == 0) && (*ptr == 0x5b)) {
          iVar5 = iVar5 + 1;
          ptr = (char *)(pbVar2 + 6);
        }
      }
      break;
    case 4:
      ptr = (char *)(pbVar2 + 2);
      if ((byte *)ptr == pbVar4) {
        return -1;
      }
      if ((pbVar2[3] == 0) && (*ptr == 0x5d)) {
        ptr = (char *)(pbVar2 + 4);
        if ((byte *)ptr == pbVar4) {
          return -1;
        }
        if ((pbVar2[5] == 0) && (*ptr == 0x3e)) {
          pbVar2 = pbVar2 + 6;
          if (iVar5 == 0) {
            iVar3 = 0x2a;
switchD_0015717c_caseD_0:
            *nextTokPtr = (char *)pbVar2;
            return iVar3;
          }
          iVar5 = iVar5 + -1;
          ptr = (char *)pbVar2;
        }
      }
      break;
    case 5:
      if ((long)pbVar4 - (long)pbVar2 < 2) {
        return -2;
      }
    default:
switchD_0015717c_caseD_3:
      ptr = (char *)(pbVar2 + 2);
      break;
    case 6:
      goto switchD_0015717c_caseD_6;
    case 7:
      goto switchD_0015717c_caseD_7;
    }
  } while( true );
switchD_0015717c_caseD_6:
  if ((long)pbVar4 - (long)pbVar2 < 3) {
    return -2;
  }
  ptr = (char *)(pbVar2 + 3);
  goto LAB_001570f8;
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}